

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O0

void print_usage(void)

{
  fprintf(_stderr,
          "Usage: bindiff [options] file1 file2\n\nIf either file1 or file2 is -, read from standard input. If both are -,\nbindiffexits immediately with no output.\n\nOptions:\n  --help: You\'re reading it now.\n  --context=N: Show N lines of matching bytes around each differing byte.\n      (Default 3)\n  --color: Highlight differing bytes even if the output is not a TTY.\n  --no-color: Don\'t highlight differing bytes even if the output is a TTY.\n  --start-address=ADDR: Address the first byte as ADDR (hex) instead of 0.\n\n"
         );
  return;
}

Assistant:

void print_usage() {
  fprintf(stderr, "\
Usage: bindiff [options] file1 file2\n\
\n\
If either file1 or file2 is -, read from standard input. If both are -,\n\
bindiffexits immediately with no output.\n\
\n\
Options:\n\
  --help: You're reading it now.\n\
  --context=N: Show N lines of matching bytes around each differing byte.\n\
      (Default 3)\n\
  --color: Highlight differing bytes even if the output is not a TTY.\n\
  --no-color: Don't highlight differing bytes even if the output is a TTY.\n\
  --start-address=ADDR: Address the first byte as ADDR (hex) instead of 0.\n\
\n");
}